

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

string * __thiscall
cmCTestP4::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestP4 *this)

{
  char **rev_00;
  reference cmd;
  ulong uVar1;
  allocator local_211;
  undefined4 local_210;
  allocator local_20a;
  undefined1 local_209;
  undefined1 local_208 [7];
  bool result;
  OutputLogger err;
  IdentifyParser out;
  string rev;
  value_type local_88;
  undefined1 local_80 [8];
  string source;
  char *local_58;
  char *local_50;
  char *local_48 [3];
  undefined1 local_30 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> p4_identify;
  cmCTestP4 *this_local;
  
  p4_identify.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  local_48[0] = "changes";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,local_48);
  local_50 = "-m";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,&local_50);
  local_58 = "1";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,&local_58);
  source.field_2._8_8_ = anon_var_dwarf_1884f4;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,
             (value_type *)((long)&source.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/...#have");
  local_88 = (value_type)std::__cxx11::string::c_str();
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,&local_88);
  rev.field_2._8_8_ = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,
             (value_type *)((long)&rev.field_2 + 8));
  rev_00 = &out.RegexIdentify.searchstring;
  std::__cxx11::string::string((string *)rev_00);
  IdentifyParser::IdentifyParser
            ((IdentifyParser *)&err.super_LineParser.Separator,this,"p4_changes-out> ",
             (string *)rev_00);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_208,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "p4_changes-err> ");
  cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30,0);
  local_209 = cmCTestVC::RunChild((cmCTestVC *)this,cmd,
                                  (OutputParser *)&err.super_LineParser.Separator,
                                  (OutputParser *)local_208,(char *)0x0);
  if ((bool)local_209) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&out.RegexIdentify.searchstring);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_211);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<unknown>",&local_20a);
    std::allocator<char>::~allocator((allocator<char> *)&local_20a);
  }
  local_210 = 1;
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_208);
  IdentifyParser::~IdentifyParser((IdentifyParser *)&err.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)&out.RegexIdentify.searchstring);
  std::__cxx11::string::~string((string *)local_80);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestP4::GetWorkingRevision()
{
  std::vector<char const*> p4_identify;
  SetP4Options(p4_identify);

  p4_identify.push_back("changes");
  p4_identify.push_back("-m");
  p4_identify.push_back("1");
  p4_identify.push_back("-t");

  std::string source = this->SourceDirectory + "/...#have";
  p4_identify.push_back(source.c_str());
  p4_identify.push_back(0);

  std::string rev;
  IdentifyParser out(this, "p4_changes-out> ", rev);
  OutputLogger err(this->Log, "p4_changes-err> ");

  bool result = RunChild(&p4_identify[0], &out, &err);

  // If there was a problem contacting the server return "<unknown>"
  if(!result)
    {
    return "<unknown>";
    }

  if(rev.empty())
    {
    return "0";
    }
  else
    {
    return rev;
    }
}